

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::ImageView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  PlatformInterface *pPVar1;
  VkAllocationCallbacks *pVVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  Unique<vk::Handle<(vk::HandleType)13>_> *ptr;
  long lVar8;
  size_type __n;
  ulong uVar9;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  objects;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_268;
  Resources res;
  Environment env;
  AllocationCallbackRecorder allocRecorder;
  
  pVVar2 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&allocRecorder,pVVar2,0x400);
  pPVar1 = context->m_platformInterface;
  pDVar3 = Context::getDeviceInterface(context);
  pVVar4 = Context::getDevice(context);
  env.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  env.programBinaries = context->m_progCollection;
  env.allocationCallbacks =
       &allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  env.maxResourceConsumers = 1;
  env.vkp = pPVar1;
  env.vkd = pDVar3;
  env.device = pVVar4;
  ImageView::Resources::Resources(&res,&env,&params);
  sVar5 = getCurrentSystemMemoryUsage(&allocRecorder);
  ImageView::create((Move<vk::Handle<(vk::HandleType)13>_> *)&local_268,&env,&res,&params);
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_268.m_data.deleter.m_device;
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_268.m_data.object.m_internal;
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_268.m_data.deleter.m_deviceIface;
  local_268.m_data.object.m_internal = 0;
  local_268.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_268.m_data.deleter.m_device = (VkDevice)0x0;
  local_268.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_268);
  sVar6 = getCurrentSystemMemoryUsage(&allocRecorder);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&objects);
  ImageView::Resources::~Resources(&res);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&allocRecorder);
  sVar5 = getSafeObjectCount(context,sVar6 - sVar5,0);
  __n = 0x4000;
  if (sVar5 < 0x4000) {
    __n = sVar5;
  }
  Environment::Environment(&env,context,(deUint32)__n);
  ImageView::Resources::Resources(&res,&env,&params);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector(&objects,__n,(allocator_type *)&allocRecorder);
  allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       (_func_int **)context->m_testCtx->m_log;
  pVVar2 = &allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pVVar2);
  std::operator<<((ostream *)pVVar2,"Creating ");
  std::ostream::_M_insert<unsigned_long>((ulong)pVVar2);
  std::operator<<((ostream *)pVVar2," ");
  pcVar7 = ::vk::getTypeName<vk::Handle<(vk::HandleType)13>>();
  std::operator<<((ostream *)pVVar2,pcVar7);
  std::operator<<((ostream *)pVVar2," objects");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&allocRecorder,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pVVar2);
  lVar8 = 0;
  for (uVar9 = 0; __n != uVar9; uVar9 = uVar9 + 1) {
    ptr = (Unique<vk::Handle<(vk::HandleType)13>_> *)operator_new(0x20);
    ImageView::create((Move<vk::Handle<(vk::HandleType)13>_> *)&allocRecorder,&env,&res,&params);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
         (VkDevice)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnAllocation;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnReallocation;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         (deUint64)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pUserData;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
         (_func_int **)0x0;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pUserData =
         (void *)0x0;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnAllocation =
         (PFN_vkAllocationFunction)0x0;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnReallocation =
         (PFN_vkReallocationFunction)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_268,ptr
              );
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
               ((long)&(objects.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar8),
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_268);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_268);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&allocRecorder);
    if ((uVar9 & 0x3ff) == 0 && uVar9 != 0) {
      tcu::TestContext::touchWatchdog(context->m_testCtx);
    }
    lVar8 = lVar8 + 0x10;
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::clear(&objects);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&allocRecorder,"Ok",(allocator<char> *)&local_268);
  tcu::TestStatus::pass(__return_storage_ptr__,(string *)&allocRecorder);
  std::__cxx11::string::~string((string *)&allocRecorder);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::~vector(&objects);
  ImageView::Resources::~Resources(&res);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}